

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * unqlite_context_realloc_chunk(unqlite_context *pCtx,void *pChunk,uint nByte)

{
  void *pvVar1;
  uint nByte_local;
  void *pChunk_local;
  unqlite_context *pCtx_local;
  
  pvVar1 = jx9_context_realloc_chunk(pCtx,pChunk,nByte);
  return pvVar1;
}

Assistant:

void * unqlite_context_realloc_chunk(unqlite_context *pCtx,void *pChunk,unsigned int nByte)
{
	return jx9_context_realloc_chunk(pCtx,pChunk,nByte);
}